

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O1

object * __thiscall
mjs::gc_heap_ptr_untracked<mjs::object,_false>::dereference
          (gc_heap_ptr_untracked<mjs::object,_false> *this,gc_heap *h)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = gc_heap::type_check<mjs::object>(h,this->pos_);
  if (!bVar2) {
    __assert_fail("h.type_check<T>(pos_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                  0x1db,
                  "T &mjs::gc_heap_ptr_untracked<mjs::object, false>::dereference(gc_heap &) const [T = mjs::object, strong = false]"
                 );
  }
  uVar1 = this->pos_;
  if (((h->alloc_context_).start_ <= uVar1) && (uVar1 < (h->alloc_context_).next_free_)) {
    return (object *)((h->alloc_context_).storage_ + uVar1);
  }
  __assert_fail("pos_inside(pos)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x13a,"slot *mjs::gc_heap::allocation_context::get_at(uint32_t) const");
}

Assistant:

T& dereference(gc_heap& h) const {
        assert(h.type_check<T>(pos_));
        return *reinterpret_cast<T*>(h.get_at(pos_));
    }